

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

int png_inflate_read(png_structrp png_ptr,png_bytep read_buffer,uInt read_size,
                    png_uint_32p chunk_bytes,png_bytep next_out,png_alloc_size_t *out_size,
                    int finish)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int extraout_EAX;
  ulong uVar4;
  long lVar5;
  undefined4 in_register_00000014;
  uint *puVar6;
  uint length;
  
  puVar6 = (uint *)CONCAT44(in_register_00000014,read_size);
  if (png_ptr->zowner != png_ptr->chunk_name) {
    (png_ptr->zstream).msg = "zstream unclaimed";
    return 0x13a482;
  }
  (png_ptr->zstream).next_out = (uchar *)chunk_bytes;
  (png_ptr->zstream).avail_out = 0;
  length = 0x400;
  while( true ) {
    if ((png_ptr->zstream).avail_in == 0) {
      uVar1 = *puVar6;
      if (uVar1 <= length) {
        length = uVar1;
      }
      *puVar6 = uVar1 - length;
      if (length != 0) {
        png_crc_read(png_ptr,read_buffer,length);
      }
      (png_ptr->zstream).next_in = read_buffer;
      (png_ptr->zstream).avail_in = length;
    }
    if ((png_ptr->zstream).avail_out == 0) {
      uVar2 = *(ulong *)next_out;
      uVar4 = 0xffffffff;
      if (uVar2 < 0xffffffff) {
        uVar4 = uVar2;
      }
      *(ulong *)next_out = uVar2 - uVar4;
      (png_ptr->zstream).avail_out = (uint32_t)uVar4;
    }
    iVar3 = 0;
    if (*puVar6 == 0) {
      iVar3 = (uint)((int)out_size != 0) * 2 + 2;
    }
    iVar3 = png_zlib_inflate(png_ptr,iVar3);
    if (iVar3 != 0) break;
    if ((*(long *)next_out == 0) && ((png_ptr->zstream).avail_out == 0)) {
      lVar5 = 0;
LAB_0011ead8:
      *(long *)next_out = lVar5;
      (png_ptr->zstream).avail_out = 0;
      png_zstream_error(png_ptr,iVar3);
      return extraout_EAX;
    }
  }
  lVar5 = (ulong)(png_ptr->zstream).avail_out + *(long *)next_out;
  goto LAB_0011ead8;
}

Assistant:

static int
png_inflate_read(png_structrp png_ptr, png_bytep read_buffer, uInt read_size,
    png_uint_32p chunk_bytes, png_bytep next_out, png_alloc_size_t *out_size,
    int finish)
{
   if (png_ptr->zowner == png_ptr->chunk_name)
   {
      int ret;

      /* next_in and avail_in must have been initialized by the caller. */
      png_ptr->zstream.next_out = next_out;
      png_ptr->zstream.avail_out = 0; /* set in the loop */

      do
      {
         if (png_ptr->zstream.avail_in == 0)
         {
            if (read_size > *chunk_bytes)
               read_size = (uInt)*chunk_bytes;
            *chunk_bytes -= read_size;

            if (read_size > 0)
               png_crc_read(png_ptr, read_buffer, read_size);

            png_ptr->zstream.next_in = read_buffer;
            png_ptr->zstream.avail_in = read_size;
         }

         if (png_ptr->zstream.avail_out == 0)
         {
            uInt avail = ZLIB_IO_MAX;
            if (avail > *out_size)
               avail = (uInt)*out_size;
            *out_size -= avail;

            png_ptr->zstream.avail_out = avail;
         }

         /* Use Z_SYNC_FLUSH when there is no more chunk data to ensure that all
          * the available output is produced; this allows reading of truncated
          * streams.
          */
         ret = PNG_INFLATE(png_ptr, *chunk_bytes > 0 ?
             Z_NO_FLUSH : (finish ? Z_FINISH : Z_SYNC_FLUSH));
      }
      while (ret == Z_OK && (*out_size > 0 || png_ptr->zstream.avail_out > 0));

      *out_size += png_ptr->zstream.avail_out;
      png_ptr->zstream.avail_out = 0; /* Should not be required, but is safe */

      /* Ensure the error message pointer is always set: */
      png_zstream_error(png_ptr, ret);
      return ret;
   }

   else
   {
      png_ptr->zstream.msg = PNGZ_MSG_CAST("zstream unclaimed");
      return Z_STREAM_ERROR;
   }
}